

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableIntTest_InsertRange_Test<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableIntTest_InsertRange_Test<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  iterator it;
  const_iterator f;
  const_iterator l;
  bool bVar1;
  value_type vVar2;
  value_type vVar3;
  reference piVar4;
  _Rb_tree_const_iterator<int> _Var5;
  _Rb_tree_const_iterator<int> _Var6;
  undefined1 uVar7;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar8;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  const_iterator set_end;
  const_iterator set_begin;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  const_iterator end;
  const_iterator begin;
  set<int,_std::less<int>,_std::allocator<int>_> set_input;
  value_type input [4];
  TypeParam ht_source;
  undefined8 in_stack_fffffffffffff948;
  set<int,_std::less<int>,_std::allocator<int>_> *this_00;
  HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff950;
  HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_01;
  undefined4 in_stack_fffffffffffff968;
  undefined4 uVar9;
  int in_stack_fffffffffffff96c;
  int iVar10;
  const_iterator *in_stack_fffffffffffff970;
  HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *__i;
  undefined4 in_stack_fffffffffffff978;
  undefined4 in_stack_fffffffffffff97c;
  Type type;
  hasher *in_stack_fffffffffffff980;
  _Base_ptr this_02;
  size_type in_stack_fffffffffffff988;
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff990;
  value_type in_stack_fffffffffffff9b0;
  int in_stack_fffffffffffff9b4;
  value_type in_stack_fffffffffffff9b8;
  int in_stack_fffffffffffff9bc;
  value_type in_stack_fffffffffffff9c0;
  int in_stack_fffffffffffff9c4;
  value_type in_stack_fffffffffffff9c8;
  int in_stack_fffffffffffff9cc;
  value_type in_stack_fffffffffffff9d0;
  undefined4 in_stack_fffffffffffff9d4;
  undefined4 uVar11;
  undefined4 in_stack_fffffffffffff9d8;
  int iVar12;
  undefined4 in_stack_fffffffffffff9dc;
  undefined8 in_stack_fffffffffffff9e0;
  undefined7 in_stack_fffffffffffff9e8;
  undefined4 in_stack_fffffffffffff9fc;
  undefined4 in_stack_fffffffffffffa0c;
  undefined4 uVar13;
  AssertionResult local_518 [2];
  size_type local_4f8;
  undefined4 local_4ec;
  AssertionResult local_4e8;
  _Base_ptr local_4d8;
  _Base_ptr local_4d0;
  _Base_ptr local_4c8;
  _Rb_tree_const_iterator<int> local_4c0;
  _Rb_tree_const_iterator<int> local_4b8;
  string local_4b0 [48];
  dense_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_480;
  dense_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_460;
  dense_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_440;
  dense_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_420;
  dense_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_400;
  dense_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_3e0;
  undefined1 local_3b9;
  AssertionResult local_3b8 [2];
  size_type local_398;
  undefined4 local_38c;
  AssertionResult local_388;
  set<int,_std::less<int>,_std::allocator<int>_> *local_378;
  HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *pHStack_370;
  _Base_ptr local_368;
  _Base_ptr p_Stack_360;
  set<int,_std::less<int>,_std::allocator<int>_> *local_358;
  HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *pHStack_350;
  _Base_ptr local_348;
  _Base_ptr p_Stack_340;
  set<int,_std::less<int>,_std::allocator<int>_> *local_338;
  HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *pHStack_330;
  _Base_ptr local_328;
  _Base_ptr p_Stack_320;
  const_iterator *pcStack_310;
  undefined8 uStack_300;
  set<int,_std::less<int>,_std::allocator<int>_> *local_2f8;
  HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *pHStack_2f0;
  _Base_ptr local_2e8;
  _Base_ptr p_Stack_2e0;
  _Base_ptr local_2d8;
  undefined1 local_2d0;
  value_type local_2c4;
  _Base_ptr local_2c0;
  undefined1 local_2b8;
  value_type local_2ac;
  _Base_ptr local_2a8;
  undefined1 local_2a0;
  value_type local_294;
  _Base_ptr local_290;
  undefined1 local_288;
  value_type local_27c;
  _Base_ptr local_278;
  undefined1 local_270;
  value_type local_264;
  _Base_ptr local_260;
  undefined1 local_258;
  value_type local_24c;
  dense_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_218;
  int local_1f8;
  value_type local_1f4;
  value_type local_1f0;
  value_type local_1ec;
  value_type local_1b4;
  value_type local_184;
  value_type local_154;
  value_type local_124;
  value_type local_f4;
  value_type local_c8;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_b8 [11];
  
  iVar10 = (int)((ulong)in_stack_fffffffffffff948 >> 0x20);
  TransparentHasher::TransparentHasher((TransparentHasher *)in_stack_fffffffffffff950,iVar10);
  TransparentHasher::TransparentHasher((TransparentHasher *)in_stack_fffffffffffff950,iVar10);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_b8,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)in_stack_fffffffffffff990,in_stack_fffffffffffff988,in_stack_fffffffffffff980,
             (key_equal *)CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
             (allocator_type *)in_stack_fffffffffffff970);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_b8);
  local_c8 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject(in_stack_fffffffffffff950,iVar10);
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
           (value_type *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
  local_f4 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject(in_stack_fffffffffffff950,iVar10);
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
           (value_type *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
  local_124 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff950,iVar10);
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
           (value_type *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
  local_154 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff950,iVar10);
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
           (value_type *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
  local_184 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff950,iVar10);
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
           (value_type *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
  local_1b4 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff950,iVar10);
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
           (value_type *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(in_stack_fffffffffffff990);
  piVar4 = google::
           dense_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::operator*(&local_218);
  local_1f8 = *piVar4;
  local_1f4 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff950,iVar10);
  local_1f0 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff950,iVar10);
  local_1ec = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff950,iVar10);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0xe53b69);
  local_24c = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff950,iVar10);
  pVar8 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff970,
                     (value_type_conflict *)
                     CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
  local_260 = (_Base_ptr)pVar8.first._M_node;
  local_258 = pVar8.second;
  local_264 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff950,iVar10);
  pVar8 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff970,
                     (value_type_conflict *)
                     CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
  local_278 = (_Base_ptr)pVar8.first._M_node;
  local_270 = pVar8.second;
  local_27c = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff950,iVar10);
  pVar8 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff970,
                     (value_type_conflict *)
                     CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
  local_290 = (_Base_ptr)pVar8.first._M_node;
  local_288 = pVar8.second;
  local_294 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff950,iVar10);
  pVar8 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff970,
                     (value_type_conflict *)
                     CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
  local_2a8 = (_Base_ptr)pVar8.first._M_node;
  local_2a0 = pVar8.second;
  uVar13 = CONCAT13(local_2a0,(int3)in_stack_fffffffffffffa0c);
  vVar2 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueObject(in_stack_fffffffffffff950,iVar10);
  local_2ac = vVar2;
  pVar8 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff970,
                     (value_type_conflict *)
                     CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
  _Var5 = pVar8.first._M_node;
  local_2b8 = pVar8.second;
  uVar11 = CONCAT13(local_2b8,(int3)in_stack_fffffffffffff9fc);
  local_2c0 = _Var5._M_node;
  vVar3 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueObject(in_stack_fffffffffffff950,iVar10);
  local_2c4 = vVar3;
  pVar8 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff970,
                     (value_type_conflict *)
                     CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
  _Var6 = pVar8.first._M_node;
  uVar7 = pVar8.second;
  local_2d8 = _Var6._M_node;
  local_2d0 = uVar7;
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(in_stack_fffffffffffff990);
  it.super_iterator.pos._0_4_ = in_stack_fffffffffffff968;
  it.super_iterator.ht =
       (dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)uStack_300;
  it.super_iterator.pos._4_4_ = in_stack_fffffffffffff96c;
  it.super_iterator.end = (pointer)in_stack_fffffffffffff970;
  it.parent_._0_4_ = in_stack_fffffffffffff978;
  it.parent_._4_4_ = in_stack_fffffffffffff97c;
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::const_iterator::const_iterator(pcStack_310,it);
  local_328 = local_2e8;
  p_Stack_320 = p_Stack_2e0;
  local_338 = local_2f8;
  pHStack_330 = pHStack_2f0;
  std::
  advance<google::BaseHashtableInterface<google::dense_hashtable<int,int,TransparentHasher,Negation<int>,SetKey<int,Negation<int>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>>::const_iterator,int>
            (in_stack_fffffffffffff970,in_stack_fffffffffffff96c);
  local_348 = local_2e8;
  p_Stack_340 = p_Stack_2e0;
  local_358 = local_2f8;
  pHStack_350 = pHStack_2f0;
  local_368 = local_328;
  p_Stack_360 = p_Stack_320;
  local_378 = local_338;
  pHStack_370 = pHStack_330;
  type = (Type)((ulong)local_328 >> 0x20);
  uVar9 = SUB84(local_338,0);
  iVar10 = (int)((ulong)local_338 >> 0x20);
  f.super_const_iterator.ht._4_4_ = in_stack_fffffffffffff9d4;
  f.super_const_iterator.ht._0_4_ = in_stack_fffffffffffff9d0;
  f.super_const_iterator.pos._0_4_ = in_stack_fffffffffffff9d8;
  f.super_const_iterator.pos._4_4_ = in_stack_fffffffffffff9dc;
  f.super_const_iterator.end = (pointer)in_stack_fffffffffffff9e0;
  f.parent_._0_7_ = in_stack_fffffffffffff9e8;
  f.parent_._7_1_ = uVar7;
  l.super_const_iterator.pos._0_4_ = vVar3;
  l.super_const_iterator.ht =
       (dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)_Var6._M_node;
  l.super_const_iterator.pos._4_4_ = uVar11;
  l.super_const_iterator.end = (pointer)_Var5._M_node;
  l.parent_._0_4_ = vVar2;
  l.parent_._4_4_ = uVar13;
  __i = pHStack_330;
  this_02 = p_Stack_320;
  google::
  BaseHashtableInterface<google::dense_hashtable<int,int,TransparentHasher,Negation<int>,SetKey<int,Negation<int>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
  ::
  insert<google::BaseHashtableInterface<google::dense_hashtable<int,int,TransparentHasher,Negation<int>,SetKey<int,Negation<int>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>>::const_iterator>
            ((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),f,l);
  local_38c = 3;
  local_398 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xe53f0c);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(iVar10,uVar9),(char *)p_Stack_2e0,&local_2e8->_M_color,
             (unsigned_long *)pHStack_2f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_388);
  this_00 = local_2f8;
  this_01 = pHStack_2f0;
  _Var5._M_node = local_2e8;
  _Var6._M_node = p_Stack_2e0;
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::AssertionResult::failure_message((AssertionResult *)0xe53fcd);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,type,(char *)__i,iVar10,(char *)p_Stack_2e0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
               (Message *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)pHStack_2f0);
    testing::Message::~Message((Message *)0xe54030);
    this_00 = local_2f8;
    this_01 = pHStack_2f0;
    _Var5._M_node = local_2e8;
    _Var6._M_node = p_Stack_2e0;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe540a1);
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(in_stack_fffffffffffff990);
  piVar4 = google::
           dense_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::operator*(&local_3e0);
  iVar12 = *piVar4;
  vVar2 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueObject(this_01,(int)((ulong)this_00 >> 0x20));
  uVar11 = CONCAT13(1,(int3)in_stack_fffffffffffff9d4);
  if (iVar12 != vVar2) {
    google::
    BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::begin(in_stack_fffffffffffff990);
    piVar4 = google::
             dense_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             ::operator*(&local_400);
    in_stack_fffffffffffff9cc = *piVar4;
    in_stack_fffffffffffff9d0 =
         HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueObject(this_01,(int)((ulong)this_00 >> 0x20));
    uVar11 = CONCAT13(1,(int3)uVar11);
    if (in_stack_fffffffffffff9cc != in_stack_fffffffffffff9d0) {
      google::
      BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::begin(in_stack_fffffffffffff990);
      piVar4 = google::
               dense_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::operator*(&local_420);
      in_stack_fffffffffffff9c4 = *piVar4;
      in_stack_fffffffffffff9c8 =
           HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueObject(this_01,(int)((ulong)this_00 >> 0x20));
      uVar11 = CONCAT13(1,(int3)uVar11);
      if (in_stack_fffffffffffff9c4 != in_stack_fffffffffffff9c8) {
        google::
        BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
        ::begin(in_stack_fffffffffffff990);
        piVar4 = google::
                 dense_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 ::operator*(&local_440);
        in_stack_fffffffffffff9bc = *piVar4;
        in_stack_fffffffffffff9c0 =
             HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject(this_01,(int)((ulong)this_00 >> 0x20));
        uVar11 = CONCAT13(1,(int3)uVar11);
        if (in_stack_fffffffffffff9bc != in_stack_fffffffffffff9c0) {
          google::
          BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::begin(in_stack_fffffffffffff990);
          piVar4 = google::
                   dense_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                   ::operator*(&local_460);
          in_stack_fffffffffffff9b4 = *piVar4;
          in_stack_fffffffffffff9b8 =
               HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueObject(this_01,(int)((ulong)this_00 >> 0x20));
          uVar11 = CONCAT13(1,(int3)uVar11);
          if (in_stack_fffffffffffff9b4 != in_stack_fffffffffffff9b8) {
            google::
            BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::begin(in_stack_fffffffffffff990);
            piVar4 = google::
                     dense_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                     ::operator*(&local_480);
            iVar12 = *piVar4;
            in_stack_fffffffffffff9b0 =
                 HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 ::UniqueObject(this_01,(int)((ulong)this_00 >> 0x20));
            uVar11 = CONCAT13(iVar12 == in_stack_fffffffffffff9b0,(int3)uVar11);
          }
        }
      }
    }
  }
  local_3b9 = (undefined1)((uint)uVar11 >> 0x18);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_01,(bool *)this_00,(type *)0xe54319);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3b8);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
               (char *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
               (char *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8),
               (char *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,type,(char *)__i,iVar10,(char *)_Var6._M_node);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(uVar11,in_stack_fffffffffffff9d0),
               (Message *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    std::__cxx11::string::~string(local_4b0);
    testing::Message::~Message((Message *)0xe543ee);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe54485);
  std::_Rb_tree_const_iterator<int>::_Rb_tree_const_iterator(&local_4b8);
  std::_Rb_tree_const_iterator<int>::_Rb_tree_const_iterator(&local_4c0);
  local_4c8 = (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::begin(this_00);
  local_4c0._M_node = local_4c8;
  local_4b8._M_node = local_4c8;
  std::advance<std::_Rb_tree_const_iterator<int>,int>((_Rb_tree_const_iterator<int> *)__i,iVar10);
  local_4d0 = local_4b8._M_node;
  local_4d8 = local_4c0._M_node;
  google::
  BaseHashtableInterface<google::dense_hashtable<int,int,TransparentHasher,Negation<int>,SetKey<int,Negation<int>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
  ::insert<std::_Rb_tree_const_iterator<int>>
            ((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              *)this_01,_Var6,_Var5);
  local_4ec = 6;
  local_4f8 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xe54549);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(iVar10,uVar9),(char *)_Var6._M_node,&(_Var5._M_node)->_M_color,
             (unsigned_long *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4e8);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::AssertionResult::failure_message((AssertionResult *)0xe545c4);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,type,(char *)__i,iVar10,(char *)_Var6._M_node);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(uVar11,in_stack_fffffffffffff9d0),
               (Message *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    testing::Message::~Message((Message *)0xe54621);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe54692);
  google::
  BaseHashtableInterface<google::dense_hashtable<int,int,TransparentHasher,Negation<int>,SetKey<int,Negation<int>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
  ::insert<int_const*>
            ((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              *)this_01,(int *)this_00,(int *)0xe546b3);
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::size((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)0xe546d1);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(iVar10,uVar9),(char *)_Var6._M_node,&(_Var5._M_node)->_M_color,
             (unsigned_long *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_518);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::AssertionResult::failure_message((AssertionResult *)0xe5474c);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,type,(char *)__i,iVar10,(char *)_Var6._M_node);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(uVar11,in_stack_fffffffffffff9d0),
               (Message *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    testing::Message::~Message((Message *)0xe547a9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe54814);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0xe54821);
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xe5482e);
  return;
}

Assistant:

TYPED_TEST(HashtableIntTest, InsertRange) {
  // We just test the ints here, to make the placement-new easier.
  TypeParam ht_source;
  ht_source.insert(this->UniqueObject(10));
  ht_source.insert(this->UniqueObject(100));
  ht_source.insert(this->UniqueObject(1000));
  ht_source.insert(this->UniqueObject(10000));
  ht_source.insert(this->UniqueObject(100000));
  ht_source.insert(this->UniqueObject(1000000));

  const typename TypeParam::value_type input[] = {
      // This is a copy of the first element in ht_source.
      *ht_source.begin(), this->UniqueObject(2), this->UniqueObject(4),
      this->UniqueObject(8)};

  set<typename TypeParam::value_type> set_input;
  set_input.insert(this->UniqueObject(1111111));
  set_input.insert(this->UniqueObject(111111));
  set_input.insert(this->UniqueObject(11111));
  set_input.insert(this->UniqueObject(1111));
  set_input.insert(this->UniqueObject(111));
  set_input.insert(this->UniqueObject(11));

  // Insert from ht_source, an iterator of the same type as us.
  typename TypeParam::const_iterator begin = ht_source.begin();
  typename TypeParam::const_iterator end = begin;
  std::advance(end, 3);
  this->ht_.insert(begin, end);  // insert 3 elements from ht_source
  EXPECT_EQ(3u, this->ht_.size());
  EXPECT_TRUE(*this->ht_.begin() == this->UniqueObject(10) ||
              *this->ht_.begin() == this->UniqueObject(100) ||
              *this->ht_.begin() == this->UniqueObject(1000) ||
              *this->ht_.begin() == this->UniqueObject(10000) ||
              *this->ht_.begin() == this->UniqueObject(100000) ||
              *this->ht_.begin() == this->UniqueObject(1000000));

  // And insert from set_input, a separate, non-random-access iterator.
  typename set<typename TypeParam::value_type>::const_iterator set_begin;
  typename set<typename TypeParam::value_type>::const_iterator set_end;
  set_begin = set_input.begin();
  set_end = set_begin;
  std::advance(set_end, 3);
  this->ht_.insert(set_begin, set_end);
  EXPECT_EQ(6u, this->ht_.size());

  // Insert from input as well, a separate, random-access iterator.
  // The first element of input overlaps with an existing element
  // of ht_, so this should only up the size by 2.
  this->ht_.insert(&input[0], &input[3]);
  EXPECT_EQ(8u, this->ht_.size());
}